

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

LOs __thiscall Omega_h::get_elem_class_ids(Omega_h *this,Mesh *mesh)

{
  Mesh *pMVar1;
  bool bVar2;
  Int ent_dim;
  uint uVar3;
  LO size_in;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  LOs LVar5;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  Mesh *local_18;
  Mesh *mesh_local;
  
  local_18 = mesh;
  mesh_local = (Mesh *)this;
  ent_dim = Mesh::dim(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"class_id",&local_39);
  bVar2 = Mesh::has_tag(mesh,ent_dim,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pMVar1 = local_18;
  if (bVar2) {
    uVar3 = Mesh::dim(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"class_id",&local_71);
    Mesh::get_array<int>((Mesh *)this,(Int)pMVar1,(string *)(ulong)uVar3);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pvVar4 = extraout_RDX;
  }
  else {
    size_in = Mesh::nelems(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    Read<int>::Read((Read<int> *)this,size_in,1,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pvVar4 = extraout_RDX_00;
  }
  LVar5.write_.shared_alloc_.direct_ptr = pvVar4;
  LVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar5.write_.shared_alloc_;
}

Assistant:

static LOs get_elem_class_ids(Mesh* mesh) {
  if (mesh->has_tag(mesh->dim(), "class_id")) {
    return mesh->get_array<ClassId>(mesh->dim(), "class_id");
  } else {
    return LOs(mesh->nelems(), 1);
  }
}